

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.cpp
# Opt level: O0

int __thiscall rsg::VariableType::getScalarSize(VariableType *this)

{
  Type TVar1;
  bool bVar2;
  int iVar3;
  pointer this_00;
  VariableType *this_01;
  __normal_iterator<const_rsg::VariableType::Member_*,_std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>_>
  local_30;
  __normal_iterator<const_rsg::VariableType::Member_*,_std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>_>
  local_28;
  const_iterator i;
  int sum;
  VariableType *this_local;
  
  TVar1 = this->m_baseType;
  if (TYPE_BOOL < TVar1) {
    if (TVar1 == TYPE_STRUCT) {
      i._M_current._4_4_ = 0;
      local_28._M_current =
           (Member *)
           std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::begin
                     (&this->m_members);
      while( true ) {
        local_30._M_current =
             (Member *)
             std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::end
                       (&this->m_members);
        bVar2 = __gnu_cxx::operator!=(&local_28,&local_30);
        if (!bVar2) break;
        this_00 = __gnu_cxx::
                  __normal_iterator<const_rsg::VariableType::Member_*,_std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>_>
                  ::operator->(&local_28);
        this_01 = Member::getType(this_00);
        iVar3 = getScalarSize(this_01);
        i._M_current._4_4_ = iVar3 + i._M_current._4_4_;
        __gnu_cxx::
        __normal_iterator<const_rsg::VariableType::Member_*,_std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>_>
        ::operator++(&local_28,0);
      }
      return i._M_current._4_4_;
    }
    if (TVar1 == TYPE_ARRAY) {
      iVar3 = getScalarSize(this->m_elementType);
      return iVar3 * this->m_numElements;
    }
    if (TVar1 != TYPE_SAMPLER_2D && TVar1 != TYPE_SAMPLER_CUBE) {
      return 0;
    }
  }
  return this->m_numElements;
}

Assistant:

int VariableType::getScalarSize (void) const
{
	switch (m_baseType)
	{
		case TYPE_VOID:
		case TYPE_FLOAT:
		case TYPE_INT:
		case TYPE_BOOL:
		case TYPE_SAMPLER_2D:
		case TYPE_SAMPLER_CUBE:
			return m_numElements;

		case TYPE_STRUCT:
		{
			int sum = 0;
			for (vector<Member>::const_iterator i = m_members.begin(); i != m_members.end(); i++)
				sum += i->getType().getScalarSize();
			return sum;
		}

		case TYPE_ARRAY:
		{
			DE_ASSERT(m_elementType);
			return m_elementType->getScalarSize() * m_numElements;
		}

		default:
			DE_ASSERT(false);
			return 0;
	}
}